

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

char * Wlc_PrsFindName(char *pStr,char **ppPlace)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  byte *pbVar5;
  bool bVar6;
  
  pcVar3 = Wlc_PrsFindName::Buffer;
  *ppPlace = Wlc_PrsFindName::Buffer;
  pbVar5 = (byte *)(pStr + -1);
  do {
    bVar2 = pbVar5[1];
    pbVar5 = pbVar5 + 1;
  } while (bVar2 == 0x20);
  if ((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
    if (0x3b < bVar2 - 0x24) {
      return (char *)0x0;
    }
    if ((0x900000000000001U >> ((ulong)(bVar2 - 0x24) & 0x3f) & 1) == 0) {
      return (char *)0x0;
    }
  }
  bVar2 = *pbVar5;
  if (bVar2 != 0) {
    pcVar3 = Wlc_PrsFindName::Buffer;
    bVar6 = true;
    iVar4 = 0;
    do {
      if (((bVar6) && (9 < (byte)(bVar2 - 0x30))) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) {
        if (bVar2 != 0x24) {
          if (bVar2 == 0x5c) goto LAB_003742e5;
          if (bVar2 != 0x5f) break;
        }
LAB_003742ec:
        bVar1 = !bVar6;
        bVar6 = true;
        if ((bVar1) && (bVar6 = false, bVar2 == 0x20)) {
          iVar4 = iVar4 + -1;
          bVar6 = iVar4 == 0;
        }
      }
      else {
        if (bVar2 != 0x5c) goto LAB_003742ec;
LAB_003742e5:
        iVar4 = iVar4 + 1;
        bVar6 = false;
      }
      *pcVar3 = bVar2;
      pcVar3 = (char *)((byte *)pcVar3 + 1);
      bVar2 = pbVar5[1];
      pbVar5 = pbVar5 + 1;
    } while (bVar2 != 0);
  }
  *pcVar3 = 0;
  return (char *)pbVar5;
}

Assistant:

static inline char * Wlc_PrsFindName( char * pStr, char ** ppPlace )
{
    static char Buffer[WLV_PRS_MAX_LINE];
    char * pThis = *ppPlace = Buffer;
    int fNotName = 1, Count = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( !Wlc_PrsIsChar(pStr) )
        return NULL;
//    while ( Wlc_PrsIsChar(pStr) )
//        *pThis++ = *pStr++;
    while ( *pStr )
    {
        if ( fNotName && !Wlc_PrsIsChar(pStr) )
            break;
        if ( *pStr == '\\' )
        {
            Count++;
            fNotName = 0;
        }
        else if ( !fNotName && *pStr == ' ' )
        {
            Count--;
            if ( !Count )
                fNotName = 1;
        }
        *pThis++ = *pStr++;
    }
    *pThis = 0;
    return pStr;
}